

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCallRef(TranslateToFuzzReader *this,Type type)

{
  Module *pMVar1;
  bool bVar2;
  Index IVar3;
  Expression *pEVar4;
  size_type sVar5;
  reference this_00;
  RefFunc *target_00;
  Iterator IVar6;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar7;
  byte local_111;
  bool local_101;
  Expression *local_c8;
  uintptr_t *local_c0;
  Type *type_1;
  Iterator __end1;
  Iterator __begin1;
  Type local_88;
  Type *local_80;
  Type *__range1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Type local_58;
  Type local_50;
  BasicType local_44;
  TranslateToFuzzReader *local_40;
  long local_38;
  size_t i;
  pointer pFStack_28;
  bool isReturn;
  Function *target;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_38 = 0;
  target = (Function *)this;
  this_local = (TranslateToFuzzReader *)type.id;
  while( true ) {
    if ((local_38 == 10) ||
       (bVar2 = std::
                vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ::empty((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                         *)(this->wasm + 0x18)), bVar2)) {
      local_40 = this_local;
      pEVar4 = makeTrivial(this,(Type)this_local);
      return pEVar4;
    }
    pMVar1 = this->wasm;
    sVar5 = std::
            vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ::size((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    *)(this->wasm + 0x18));
    IVar3 = upTo(this,(Index)sVar5);
    this_00 = std::
              vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ::operator[]((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            *)(pMVar1 + 0x18),(ulong)IVar3);
    pFStack_28 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(this_00)
    ;
    local_44 = unreachable;
    bVar2 = Type::operator==((Type *)&this_local,&local_44);
    local_101 = false;
    if (bVar2) {
      bVar2 = FeatureSet::hasTailCall((FeatureSet *)(this->wasm + 0x108));
      local_101 = false;
      if (bVar2) {
        local_50 = Function::getResults(this->funcContext->func);
        local_58 = Function::getResults(pFStack_28);
        local_101 = Type::operator==(&local_50,&local_58);
      }
    }
    i._7_1_ = local_101;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)Function::getResults(pFStack_28);
    bVar2 = Type::operator==((Type *)&args.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (Type *)&this_local);
    local_111 = 1;
    if (!bVar2) {
      local_111 = i._7_1_;
    }
    if ((local_111 & 1) != 0) break;
    local_38 = local_38 + 1;
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
  local_88 = Function::getParams(pFStack_28);
  local_80 = &local_88;
  IVar6 = Type::begin(local_80);
  __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)IVar6.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
  PVar7 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(local_80);
  while( true ) {
    __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)PVar7.index;
    type_1 = PVar7.parent;
    bVar2 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                       &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                              &type_1);
    if (!bVar2) break;
    local_c0 = (uintptr_t *)
               wasm::Type::Iterator::operator*
                         ((Iterator *)
                          &__end1.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         );
    local_c8 = make(this,(Type)*local_c0);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1,
               &local_c8);
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
               &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    PVar7.index = (size_t)__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .parent;
    PVar7.parent = type_1;
  }
  target_00 = Builder::makeRefFunc
                        (&this->builder,
                         (Name)(pFStack_28->super_Importable).super_Named.name.super_IString.str,
                         (HeapType)(pFStack_28->type).id);
  type_local.id =
       (uintptr_t)
       Builder::makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                 (&this->builder,(Expression *)target_00,
                  (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1,
                  (Type)this_local,(bool)(i._7_1_ & 1));
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeCallRef(Type type) {
  // look for a call target with the right type
  Function* target;
  bool isReturn;
  size_t i = 0;
  while (1) {
    if (i == TRIES || wasm.functions.empty()) {
      // We can't find a proper target, give up.
      return makeTrivial(type);
    }
    // TODO: handle unreachable
    target = wasm.functions[upTo(wasm.functions.size())].get();
    isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
               funcContext->func->getResults() == target->getResults();
    if (target->getResults() == type || isReturn) {
      break;
    }
    i++;
  }
  std::vector<Expression*> args;
  for (const auto& type : target->getParams()) {
    args.push_back(make(type));
  }
  // TODO: half the time make a completely random item with that type.
  return builder.makeCallRef(
    builder.makeRefFunc(target->name, target->type), args, type, isReturn);
}